

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

string * SSTable::get(string *__return_storage_ptr__,string *fileName,uint64_t key)

{
  int iVar1;
  char *pcVar2;
  runtime_error *this;
  uint64_t i;
  ulong uVar3;
  int _offset;
  uint64_t _key;
  uint64_t length;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,(string *)fileName,_S_in|_S_bin);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_key,
                   "readDic: Open file ",fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&length,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_key,
                   " failed!");
    std::runtime_error::runtime_error(this,(string *)&length);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg((long)&in,8);
  read64(&in,&length);
  std::istream::seekg((long)&in,0x2820);
  uVar3 = 0;
  do {
    if (length <= uVar3) {
LAB_00108b0d:
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&_key);
LAB_00108b21:
      std::ifstream::~ifstream(&in);
      return __return_storage_ptr__;
    }
    read64(&in,&_key);
    read32(&in,&_offset);
    iVar1 = _offset;
    if (_key == key) {
      read64(&in,&_key);
      read32(&in,&_offset);
      if (-1 < iVar1) {
        std::istream::seekg((long)&in,iVar1 + (int)length * 0xc + 0x282c);
        pcVar2 = (char *)operator_new__(((long)_offset - (long)iVar1) + 1);
        std::istream::read((char *)&in,(long)pcVar2);
        pcVar2[(long)_offset - (long)iVar1] = '\0';
        std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&_key);
        operator_delete__(pcVar2);
        std::ifstream::close();
        goto LAB_00108b21;
      }
      goto LAB_00108b0d;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

string SSTable::get(const string &fileName, uint64_t key) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  in.seekg(8, ifstream::beg);  // skip timeStamp
  uint64_t length;
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  int offset = -1;
  int valueSize = -1;
  for (uint64_t i = 0; i < length; i++) {
    uint64_t _key;
    int _offset;
    read64(in, _key);
    read32(in, _offset);
    if (_key == key) {
      offset = _offset;
      read64(in, _key);
      read32(in, _offset);
      valueSize = _offset - offset;
      break;
    }
  }
  if (offset < 0) return "";
  in.seekg(10272 + (length + 1) * 12 + offset, ifstream::beg);
  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}